

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.cc
# Opt level: O2

ssize_t __thiscall SimpleLogger::LogElem::write(LogElem *this,int __fd,void *__buf,size_t __n)

{
  bool bVar1;
  ssize_t sVar2;
  size_t __n_00;
  undefined4 in_register_00000034;
  Status exp;
  
  exp = CLEAN;
  bVar1 = std::atomic<SimpleLogger::LogElem::Status>::compare_exchange_strong
                    (&this->status,&exp,WRITING,memory_order_seq_cst);
  if (bVar1) {
    __n_00 = 0x1000;
    if (CONCAT44(in_register_00000034,__fd) < 0x1000) {
      __n_00 = CONCAT44(in_register_00000034,__fd);
    }
    this->len = __n_00;
    memcpy(this->ctx,__buf,__n_00);
    LOCK();
    (this->status)._M_i = DIRTY;
    UNLOCK();
    sVar2 = 0;
  }
  else {
    sVar2 = -1;
  }
  return sVar2;
}

Assistant:

int SimpleLogger::LogElem::write(size_t _len, char* msg) {
    Status exp = CLEAN;
    Status val = WRITING;
    if (!status.compare_exchange_strong(exp, val)) return -1;

    len = (_len > MSG_SIZE) ? MSG_SIZE : _len;
    memcpy(ctx, msg, len);

    status.store(LogElem::DIRTY);
    return 0;
}